

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::InnerMap
          (void *param_1,size_type param_2,undefined8 param_3)

{
  size_type sVar1;
  size_type sVar2;
  void **ppvVar3;
  size_type in_stack_00000098;
  InnerMap *in_stack_000000a0;
  
  *(undefined8 *)param_1 = 0;
  sVar1 = Seed((InnerMap *)param_1);
  *(size_type *)((long)param_1 + 0x10) = sVar1;
  *(undefined8 *)((long)param_1 + 0x20) = 0;
  *(undefined8 *)((long)param_1 + 0x28) = param_3;
  sVar2 = TableSize((InnerMap *)param_1,param_2);
  ppvVar3 = CreateEmptyTable(in_stack_000000a0,in_stack_00000098);
  *(void ***)((long)param_1 + 0x20) = ppvVar3;
  *(size_type *)((long)param_1 + 0x18) = sVar2;
  *(size_type *)((long)param_1 + 8) = sVar2;
  return;
}

Assistant:

InnerMap(size_type n, hasher h, Allocator alloc)
        : hasher(h),
          num_elements_(0),
          seed_(Seed()),
          table_(NULL),
          alloc_(alloc) {
      n = TableSize(n);
      table_ = CreateEmptyTable(n);
      num_buckets_ = index_of_first_non_null_ = n;
    }